

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *unaff_R15;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (this->max_height_).super___atomic_base<int>._M_i - 1;
  pNVar5 = this->head_;
  do {
    if (pNVar5 != this->head_) {
      iVar3 = MemTable::KeyComparator::operator()(&this->compare_,pNVar5->key,*key);
      if (-1 < iVar3) {
        __assert_fail("x == head_ || compare_(x->key, key) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/skiplist.h"
                      ,0x121,
                      "typename SkipList<Key, Comparator>::Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::FindLessThan(const Key &) const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                     );
      }
    }
    if ((int)uVar4 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/skiplist.h"
                    ,0x9a,
                    "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
    pNVar6 = pNVar5->next_[uVar4]._M_b._M_p;
    if (pNVar6 == (Node *)0x0) {
LAB_006539f1:
      pNVar6 = pNVar5;
      if (uVar4 == 0) {
        uVar4 = 0;
        bVar2 = false;
        unaff_R15 = pNVar5;
      }
      else {
        uVar4 = uVar4 - 1;
        bVar2 = true;
      }
    }
    else {
      iVar3 = MemTable::KeyComparator::operator()(&this->compare_,pNVar6->key,*key);
      if (-1 < iVar3) goto LAB_006539f1;
      bVar2 = true;
    }
    pNVar5 = pNVar6;
    if (!bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return unaff_R15;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}